

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall TiXmlDocument::Print(TiXmlDocument *this,FILE *cfile,int depth)

{
  TiXmlNode *pTVar1;
  TiXmlNode **ppTVar2;
  
  if (cfile != (FILE *)0x0) {
    ppTVar2 = &(this->super_TiXmlNode).firstChild;
    while (pTVar1 = *ppTVar2, pTVar1 != (TiXmlNode *)0x0) {
      (*(pTVar1->super_TiXmlBase)._vptr_TiXmlBase[2])(pTVar1,cfile,(ulong)(uint)depth);
      fputc(10,(FILE *)cfile);
      ppTVar2 = &pTVar1->next;
    }
    return;
  }
  __assert_fail("cfile",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                ,0x47b,"virtual void TiXmlDocument::Print(FILE *, int) const");
}

Assistant:

void TiXmlDocument::Print( FILE* cfile, int depth ) const
{
	assert( cfile );
	for ( const TiXmlNode* node=FirstChild(); node; node=node->NextSibling() )
	{
		node->Print( cfile, depth );
		fprintf( cfile, "\n" );
	}
}